

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_lpc_swb.c
# Opt level: O3

int16_t WebRtcIsac_DecorrelateInterVec(double *data,double *out,int16_t bandwidth)

{
  double (*padVar1) [4];
  int iVar2;
  int iVar3;
  undefined6 in_register_00000012;
  int iVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  short sVar8;
  double dVar9;
  
  iVar2 = (int)CONCAT62(in_register_00000012,bandwidth);
  if (iVar2 == 0xc) {
    iVar2 = 2;
    padVar1 = (double (*) [4])WebRtcIsac_kInterVecDecorrMatUb12;
  }
  else {
    if (iVar2 != 0x10) {
      return -1;
    }
    iVar2 = 4;
    padVar1 = WebRtcIsac_kInterVecDecorrMatUb16;
  }
  iVar3 = 0;
  do {
    iVar6 = 0;
    sVar5 = 0;
    do {
      iVar7 = iVar3 + iVar6 * 4;
      out[iVar7] = 0.0;
      iVar4 = 0;
      dVar9 = 0.0;
      sVar8 = 1;
      do {
        dVar9 = dVar9 + data[iVar3 + iVar4 * 4] * (*padVar1)[iVar4 * iVar2 + iVar6];
        out[iVar7] = dVar9;
        iVar4 = (int)sVar8;
        sVar8 = sVar8 + 1;
      } while (iVar4 < iVar2);
      sVar5 = sVar5 + 1;
      iVar6 = (int)sVar5;
    } while (iVar6 < iVar2);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  return 0;
}

Assistant:

int16_t
WebRtcIsac_DecorrelateInterVec(
    const double* data,
    double* out,
    int16_t bandwidth)
{
  int16_t coeffCntr;
  int16_t rowCntr;
  int16_t colCntr;
  const double* decorrMat;
  int16_t interVecDim;

  switch(bandwidth)
  {
    case isac12kHz:
      {
        decorrMat = &WebRtcIsac_kInterVecDecorrMatUb12[0][0];
        interVecDim = UB_LPC_VEC_PER_FRAME;
        break;
      }
    case isac16kHz:
      {
        decorrMat = &WebRtcIsac_kInterVecDecorrMatUb16[0][0];
        interVecDim = UB16_LPC_VEC_PER_FRAME;
        break;
      }
    default:
      return -1;
  }

  //
  // data * decorrMat
  //
  // data is of size 'interVecDim' * 'UB_LPC_ORDER'
  // That is 'interVecDim' of LAR vectors (mean removed)
  // in columns each of dimension 'UB_LPC_ORDER'.
  // matrix is stored column-wise.
  //

  for(coeffCntr = 0; coeffCntr < UB_LPC_ORDER; coeffCntr++)
  {
    for(colCntr = 0; colCntr < interVecDim; colCntr++)
    {
      out[coeffCntr + colCntr * UB_LPC_ORDER] = 0;
      for(rowCntr = 0; rowCntr < interVecDim; rowCntr++)
      {
        out[coeffCntr + colCntr * UB_LPC_ORDER] +=
            data[coeffCntr + rowCntr * UB_LPC_ORDER] *
            decorrMat[rowCntr * interVecDim + colCntr];
      }
    }
  }
  return 0;
}